

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

void __thiscall clipp::parser::clean_miss_candidates_for(parser *this,dfs_traverser *match)

{
  reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::miss_candidate_*,_std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>_>_>
  i;
  pointer local_28;
  pointer local_20;
  pointer local_18;
  
  local_20 = (this->missCand_).
             super__Vector_base<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_18 = (this->missCand_).
             super__Vector_base<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::miss_candidate*,std::vector<clipp::parser::miss_candidate,std::allocator<clipp::parser::miss_candidate>>>>,__gnu_cxx::__ops::_Iter_pred<clipp::parser::clean_miss_candidates_for(clipp::group::depth_first_traverser_const&)::_lambda(clipp::parser::miss_candidate_const&)_1_>>
            (&local_28,&local_18,&local_20,match);
  if (local_28 !=
      (this->missCand_).
      super__Vector_base<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>::
    _M_erase(&this->missCand_,local_28 + -1);
  }
  return;
}

Assistant:

void clean_miss_candidates_for(const dfs_traverser& match)
    {
        auto i = std::find_if(missCand_.rbegin(), missCand_.rend(),
            [&](const miss_candidate& m) {
                return &(*m.pos) == &(*match);
            });

        if(i != missCand_.rend()) {
            missCand_.erase(prev(i.base()));
        }
    }